

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::SectionTracking::TestCaseTracker::leaveSection(TestCaseTracker *this)

{
  TrackedSection *pTVar1;
  long in_RDI;
  
  TrackedSection::leave(&this->m_testCase);
  pTVar1 = TrackedSection::getParent(*(TrackedSection **)(in_RDI + 0x60));
  *(TrackedSection **)(in_RDI + 0x60) = pTVar1;
  if (*(long *)(in_RDI + 0x60) != 0) {
    *(undefined1 *)(in_RDI + 0x68) = 1;
    return;
  }
  __assert_fail("m_currentSection != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/I3ck[P]LazyTrees/tests/../dependencies/Catch.h"
                ,0x1308,"void Catch::SectionTracking::TestCaseTracker::leaveSection()");
}

Assistant:

void leaveSection() {
            m_currentSection->leave();
            m_currentSection = m_currentSection->getParent();
            assert( m_currentSection != NULL );
            m_completedASectionThisRun = true;
        }